

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O0

bool __thiscall
auto_array<unsigned_int>::pop(auto_array<unsigned_int> *this,uint *elements,size_t length)

{
  uint *in_RDX;
  long in_RSI;
  uint *in_RDI;
  bool local_1;
  
  if (*(uint **)(in_RDI + 4) < in_RDX) {
    local_1 = false;
  }
  else {
    if (in_RSI != 0) {
      PodCopy<unsigned_int>(in_RDX,in_RDI,0x133cdc);
    }
    PodMove<unsigned_int>(in_RDX,in_RDI,0x133d00);
    *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) - (long)in_RDX;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool pop(T * elements, size_t length)
  {
    if (length > length_) {
      return false;
    }
    if (elements) {
      PodCopy(elements, data_, length);
    }
    PodMove(data_, data_ + length, length_ - length);

    length_ -= length;

    return true;
  }